

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyStamp.hpp
# Opt level: O0

void __thiscall OpenMD::RigidBodyStamp::~RigidBodyStamp(RigidBodyStamp *this)

{
  RigidBodyStamp *in_RDI;
  
  ~RigidBodyStamp(in_RDI);
  operator_delete(in_RDI,0x88);
  return;
}

Assistant:

int getIndex() { return index_; }